

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

void __thiscall RenX_ServerListPlugin::~RenX_ServerListPlugin(RenX_ServerListPlugin *this)

{
  undefined8 uVar1;
  undefined8 in_R9;
  __sv_type _Var2;
  __sv_type _Var3;
  __sv_type _Var4;
  undefined4 local_a8;
  undefined4 uStack_a0;
  size_t local_98;
  char *local_90;
  size_t local_88;
  char *local_80;
  undefined4 local_78;
  undefined4 uStack_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  undefined4 local_48;
  undefined4 uStack_40;
  size_t local_38;
  char *local_30;
  size_t local_28;
  char *local_20;
  Server *server;
  RenX_ServerListPlugin *this_local;
  
  *(undefined ***)this = &PTR_think_001397a0;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00139c80;
  uVar1 = getHTTPServer();
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_hostname);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&this->m_server_list_page_name);
  local_28 = _Var2._M_len;
  local_20 = _Var2._M_str;
  local_38 = _Var3._M_len;
  local_30 = _Var3._M_str;
  local_48 = (undefined4)_Var4._M_len;
  uStack_40 = _Var4._M_str._0_4_;
  Jupiter::HTTP::Server::remove(uVar1,local_28,local_20,local_38,local_30,in_R9,local_48,uStack_40);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_hostname);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&this->m_server_list_long_page_name);
  local_58 = _Var2._M_len;
  local_50 = _Var2._M_str;
  local_68 = _Var3._M_len;
  local_60 = _Var3._M_str;
  local_78 = (undefined4)_Var4._M_len;
  uStack_70 = _Var4._M_str._0_4_;
  Jupiter::HTTP::Server::remove(uVar1,local_58,local_50,local_68,local_60,in_R9,local_78,uStack_70);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_hostname);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_web_path);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&this->m_server_page_name);
  local_88 = _Var2._M_len;
  local_80 = _Var2._M_str;
  local_98 = _Var3._M_len;
  local_90 = _Var3._M_str;
  local_a8 = (undefined4)_Var4._M_len;
  uStack_a0 = _Var4._M_str._0_4_;
  Jupiter::HTTP::Server::remove(uVar1,local_88,local_80,local_98,local_90,in_R9,local_a8,uStack_a0);
  std::__cxx11::string::~string((string *)&this->m_metadata_prometheus_page_name);
  std::__cxx11::string::~string((string *)&this->m_metadata_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_list_long_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_list_page_name);
  std::__cxx11::string::~string((string *)&this->m_web_path);
  std::__cxx11::string::~string((string *)&this->m_web_hostname);
  std::__cxx11::string::~string((string *)&this->m_metadata_prometheus);
  std::__cxx11::string::~string((string *)&this->m_metadata_json);
  std::__cxx11::string::~string((string *)&this->m_server_list_json);
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ServerListPlugin::~RenX_ServerListPlugin() {
	Jupiter::HTTP::Server &server = getHTTPServer();
	server.remove(m_web_hostname, m_web_path, m_server_list_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_list_long_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_page_name);
}